

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::create_macro_symtab_lookup_table(CVmImageLoader *this)

{
  vm_obj_id_t vVar1;
  vm_val_t *this_00;
  CVmObject *key;
  size_t in_RDI;
  size_t len;
  char *p;
  CVmObjList *argp;
  CVmObjList *lstp;
  int i;
  vm_val_t v;
  vm_val_t args;
  vm_val_t lst;
  vm_val_t str;
  vm_runtime_sym *sym;
  CVmObjLookupTable *lookup;
  CVmObjList *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  CVmObject *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar2;
  vm_val_t local_58;
  vm_val_t local_48;
  vm_val_t local_38;
  vm_val_t local_28;
  vm_runtime_sym *local_18;
  CVmObject *local_10;
  
  if ((*(long *)(in_RDI + 0x68) != 0) && (*(int *)(in_RDI + 0x74) == 0)) {
    CVmRuntimeSymbols::get_sym_count(*(CVmRuntimeSymbols **)(in_RDI + 0x68));
    vVar1 = CVmObjLookupTable::create
                      ((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (uint)in_stack_ffffffffffffff80,(uint)(in_RDI >> 0x20));
    *(vm_obj_id_t *)(in_RDI + 0x74) = vVar1;
    local_10 = vm_objp(0);
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,*(vm_obj_id_t *)(in_RDI + 0x74));
    for (local_18 = CVmRuntimeSymbols::get_head(*(CVmRuntimeSymbols **)(in_RDI + 0x68));
        iVar2 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20), local_18 != (vm_runtime_sym *)0x0;
        local_18 = local_18->nxt) {
      vVar1 = CVmObjString::create
                        (iVar2,in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
      vm_val_t::set_obj(&local_28,vVar1);
      CVmStack::push(&local_28);
      vVar1 = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_RDI);
      vm_val_t::set_obj(&local_38,vVar1);
      CVmStack::push(&local_38);
      key = vm_objp(0);
      CVmObjList::cons_clear(in_stack_ffffffffffffff80);
      vVar1 = CVmObjString::create
                        (iVar2,in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
      vm_val_t::set_obj(&local_58,vVar1);
      CVmObjList::cons_set_element(in_stack_ffffffffffffff80,in_RDI,(vm_val_t *)0x30c70a);
      vVar1 = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_RDI);
      vm_val_t::set_obj(&local_48,vVar1);
      in_stack_ffffffffffffff90 = vm_objp(0);
      CVmObjList::cons_clear(in_stack_ffffffffffffff80);
      CVmObjList::cons_set_element(in_stack_ffffffffffffff80,in_RDI,(vm_val_t *)0x30c752);
      for (iVar2 = 0; iVar2 < local_18->macro_argc; iVar2 = iVar2 + 1) {
        in_stack_ffffffffffffff88 = local_18->macro_args[iVar2];
        in_stack_ffffffffffffff80 = (CVmObjList *)strlen(in_stack_ffffffffffffff88);
        vVar1 = CVmObjString::create
                          ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88
                           ,(size_t)in_stack_ffffffffffffff80);
        vm_val_t::set_obj(&local_58,vVar1);
        CVmObjList::cons_set_element(in_stack_ffffffffffffff80,in_RDI,(vm_val_t *)0x30c7bf);
      }
      vm_val_t::set_int(&local_58,local_18->macro_flags);
      CVmObjList::cons_set_element(in_stack_ffffffffffffff80,in_RDI,(vm_val_t *)0x30c7f2);
      CVmObjLookupTable::add_entry
                ((CVmObjLookupTable *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),(vm_val_t *)key,
                 (vm_val_t *)in_stack_ffffffffffffff90);
      CVmStack::discard(2);
    }
    CVmStack::discard();
  }
  return;
}

Assistant:

void CVmImageLoader::create_macro_symtab_lookup_table(VMG0_)
{
    CVmObjLookupTable *lookup;
    vm_runtime_sym *sym;

    /* 
     *   if we don't have a runtime macro table, we can't create the
     *   reflection LookupTable 
     */
    if (runtime_macros_ == 0)
        return;

    /* if we already created the table, there's no need to create another */
    if (reflection_macros_ != VM_INVALID_OBJ)
        return;

    /* create a LookupTable to hold the symbols */
    reflection_macros_ = CVmObjLookupTable::
        create(vmg_ FALSE, 256, runtime_macros_->get_sym_count());

    /* get the object, properly cast */
    lookup = (CVmObjLookupTable *)vm_objp(vmg_ reflection_macros_);

    /* push the lookup table onto the stack for gc protection */
    G_stk->push()->set_obj(reflection_macros_);

    /* run through the symbols and populate the LookupTable */
    for (sym = runtime_macros_->get_head() ; sym != 0 ; sym = sym->nxt)
    {
        vm_val_t str;
        vm_val_t lst;
        vm_val_t args;
        vm_val_t v;
        int i;

        /* create a string object to hold this symbol */
        str.set_obj(CVmObjString::create(vmg_ FALSE, sym->sym, sym->len));

        /* stack it for gc protection */
        G_stk->push(&str);

        /* 
         *   Create a list to hold the definition.  We represent this as
         *   [expansion_string, [argument_list], flags]. 
         */
        lst.set_obj(CVmObjList::create(vmg_ FALSE, 3));
        G_stk->push(&lst);
        CVmObjList *lstp = (CVmObjList *)vm_objp(vmg_ lst.val.obj);
        lstp->cons_clear();

        /* create and store the expansion string */
        v.set_obj(CVmObjString::create(
            vmg_ FALSE, sym->macro_expansion, sym->macro_exp_len));
        lstp->cons_set_element(0, &v);

        /* create the argument list */
        args.set_obj(CVmObjList::create(vmg_ FALSE, sym->macro_argc));
        CVmObjList *argp = (CVmObjList *)vm_objp(vmg_ args.val.obj);
        argp->cons_clear();

        /* store the argument list in the definition list */
        lstp->cons_set_element(1, &args);

        /* store the arguments */
        for (i = 0 ; i < sym->macro_argc ; ++i)
        {
            /* create the string */
            char *p = sym->macro_args[i];
            size_t len = strlen(p);
            v.set_obj(CVmObjString::create(vmg_ FALSE, p, len));

            /* store it in the argument list */
            argp->cons_set_element(i, &v);
        }

        /* store the flags */
        v.set_int(sym->macro_flags);
        lstp->cons_set_element(2, &v);

        /* 
         *   add the macro to the lookup table - the symbol string is the
         *   key, and the symbol's value is the definition list
         */
        lookup->add_entry(vmg_ &str, &lst);

        /* done with the symbol and list gc protection */
        G_stk->discard(2);
    }

    /* done working - discard our gc protection */
    G_stk->discard();
}